

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnCallIndirectExpr(Validator *this,CallIndirectExpr *expr)

{
  Var local_b8;
  Var local_70;
  Enum local_24;
  CallIndirectExpr *local_20;
  CallIndirectExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (CallIndirectExpr *)this;
  GetFuncTypeIndex(&local_70,this,&(expr->super_ExprMixin<(wabt::ExprType)13>).super_Expr.loc,
                   &expr->decl);
  Var::Var(&local_b8,&local_20->table);
  local_24 = (Enum)SharedValidator::OnCallIndirect
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)13>).super_Expr.loc,&local_70,
                              &local_b8);
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_b8);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnCallIndirectExpr(CallIndirectExpr* expr) {
  result_ |= validator_.OnCallIndirect(
      expr->loc, GetFuncTypeIndex(expr->loc, expr->decl), expr->table);
  return Result::Ok;
}